

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema_compile.c
# Opt level: O1

LY_ERR lys_compile(lys_module *mod,lys_depset_unres *unres)

{
  void **ppvVar1;
  lysp_submodule *plVar2;
  ly_ctx *ctx_00;
  lysc_ext_instance *plVar3;
  lysp_ext_instance *plVar4;
  lysp_include *plVar5;
  lysp_submodule *plVar6;
  bool bVar7;
  bool bVar8;
  LY_ERR LVar9;
  lysc_module *module;
  long *plVar10;
  lysp_ext_instance *plVar11;
  lysp_ext_instance *plVar12;
  lysp_node_grp *plVar13;
  ulong uVar14;
  char *pcVar15;
  undefined8 uVar16;
  ulong uVar17;
  void *pvVar18;
  lysp_node_action *plVar19;
  lysp_node_notif *plVar20;
  lysp_node *plVar21;
  long lVar22;
  lysc_ctx ctx;
  ulong local_10e0;
  lysc_ctx local_10d0;
  
  memset(&local_10d0,0,0x10a0);
  if (mod == (lys_module *)0x0) {
    pcVar15 = "mod";
LAB_00142108:
    ly_log((ly_ctx *)0x0,LY_LLERR,LY_EINVAL,"Invalid argument %s (%s()).",pcVar15,"lys_compile");
    return LY_EINVAL;
  }
  plVar2 = (lysp_submodule *)mod->parsed;
  if (plVar2 == (lysp_submodule *)0x0) {
    pcVar15 = "mod->parsed";
    goto LAB_00142108;
  }
  if (mod->compiled != (lysc_module *)0x0) {
    pcVar15 = "!mod->compiled";
    goto LAB_00142108;
  }
  ctx_00 = mod->ctx;
  if (ctx_00 == (ly_ctx *)0x0) {
    pcVar15 = "mod->ctx";
    goto LAB_00142108;
  }
  if ((mod->implemented == '\0') || (mod->to_compile == '\0')) {
    __assert_fail("mod->implemented && mod->to_compile",
                  "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/schema_compile.c"
                  ,0x6b2,"LY_ERR lys_compile(struct lys_module *, struct lys_depset_unres *)");
  }
  local_10d0.cur_mod = plVar2->mod;
  local_10d0.ctx = (local_10d0.cur_mod)->ctx;
  local_10d0.ext = (lysc_ext_instance *)0x0;
  local_10d0.path_len = 1;
  local_10d0.path[0] = '/';
  local_10d0.free_ctx.ctx = plVar2->mod->ctx;
  ctx_00->change_count = ctx_00->change_count + 1;
  local_10d0.pmod = (lysp_module *)plVar2;
  local_10d0.unres = unres;
  module = (lysc_module *)calloc(1,0x28);
  mod->compiled = module;
  if (module == (lysc_module *)0x0) {
    ly_log(ctx_00,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","lys_compile");
    return LY_EMEM;
  }
  module->mod = mod;
  LVar9 = lys_precompile_own_augments(&local_10d0);
  if ((LVar9 == LY_SUCCESS) &&
     (LVar9 = lys_precompile_own_deviations(&local_10d0), LVar9 == LY_SUCCESS)) {
    plVar21 = plVar2->data;
    if (plVar21 != (lysp_node *)0x0) {
      do {
        LVar9 = lys_compile_node(&local_10d0,plVar21,(lysc_node *)0x0,0,(ly_set *)0x0);
        if (LVar9 != LY_SUCCESS) goto LAB_001421f1;
        plVar21 = plVar21->next;
      } while (plVar21 != (lysp_node *)0x0);
    }
    plVar19 = plVar2->rpcs;
    if (plVar19 != (lysp_node_action *)0x0) {
      do {
        LVar9 = lys_compile_node(&local_10d0,(lysp_node *)plVar19,(lysc_node *)0x0,0,(ly_set *)0x0);
        if (LVar9 != LY_SUCCESS) goto LAB_001421f1;
        plVar19 = (lysp_node_action *)(plVar19->field_0).node.next;
      } while (plVar19 != (lysp_node_action *)0x0);
    }
    plVar20 = plVar2->notifs;
    if (plVar20 != (lysp_node_notif *)0x0) {
      do {
        LVar9 = lys_compile_node(&local_10d0,(lysp_node *)plVar20,(lysc_node *)0x0,0,(ly_set *)0x0);
        if (LVar9 != LY_SUCCESS) goto LAB_001421f1;
        plVar20 = (lysp_node_notif *)(plVar20->field_0).node.next;
      } while (plVar20 != (lysp_node_notif *)0x0);
    }
    plVar11 = plVar2->exts;
    if (plVar11 == (lysp_ext_instance *)0x0) {
      LVar9 = LY_SUCCESS;
LAB_00142612:
      uVar17 = 0;
      do {
        plVar5 = plVar2->includes;
        if (plVar5 == (lysp_include *)0x0) {
          uVar14 = 0;
        }
        else {
          uVar14 = *(ulong *)(plVar5[-1].rev + 8);
        }
        if (uVar14 <= uVar17) {
          local_10d0.compile_opts._0_1_ = (byte)local_10d0.compile_opts | 1;
          plVar13 = plVar2->groupings;
          local_10d0.pmod = (lysp_module *)plVar2;
          if (plVar13 == (lysp_node_grp *)0x0) goto LAB_001428ae;
          goto LAB_00142887;
        }
        plVar6 = plVar5[uVar17].submodule;
        plVar21 = plVar6->data;
        local_10d0.pmod = (lysp_module *)plVar6;
        if (plVar21 != (lysp_node *)0x0) {
          do {
            LVar9 = lys_compile_node(&local_10d0,plVar21,(lysc_node *)0x0,0,(ly_set *)0x0);
            if (LVar9 != LY_SUCCESS) goto LAB_001421f1;
            plVar21 = plVar21->next;
          } while (plVar21 != (lysp_node *)0x0);
          LVar9 = LY_SUCCESS;
        }
        plVar19 = plVar6->rpcs;
        if (plVar19 != (lysp_node_action *)0x0) {
          do {
            LVar9 = lys_compile_node(&local_10d0,(lysp_node *)plVar19,(lysc_node *)0x0,0,
                                     (ly_set *)0x0);
            if (LVar9 != LY_SUCCESS) goto LAB_001421f1;
            plVar19 = (lysp_node_action *)(plVar19->field_0).node.next;
          } while (plVar19 != (lysp_node_action *)0x0);
          LVar9 = LY_SUCCESS;
        }
        plVar20 = plVar6->notifs;
        if (plVar20 != (lysp_node_notif *)0x0) {
          do {
            LVar9 = lys_compile_node(&local_10d0,(lysp_node *)plVar20,(lysc_node *)0x0,0,
                                     (ly_set *)0x0);
            if (LVar9 != LY_SUCCESS) goto LAB_001421f1;
            plVar20 = (lysp_node_notif *)(plVar20->field_0).node.next;
          } while (plVar20 != (lysp_node_notif *)0x0);
          LVar9 = LY_SUCCESS;
        }
        plVar11 = plVar6->exts;
        if (plVar11 != (lysp_ext_instance *)0x0) {
          plVar3 = module->exts;
          if (plVar3 == (lysc_ext_instance *)0x0) {
            pvVar18 = (void *)0x0;
            plVar10 = (long *)calloc(1,(long)plVar11[-1].exts * 0x48 + 8);
          }
          else {
            pvVar18 = plVar3[-1].compiled;
            plVar10 = (long *)realloc(&plVar3[-1].compiled,
                                      ((long)&(plVar11[-1].exts)->name +
                                      (long)plVar3[-1].compiled + (long)pvVar18) * 0x48 + 8);
          }
          if (plVar10 == (long *)0x0) {
            bVar7 = false;
            LVar9 = LY_EMEM;
            ly_log(local_10d0.ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).");
            bVar8 = true;
          }
          else {
            module->exts = (lysc_ext_instance *)(plVar10 + 1);
            if (plVar6->exts == (lysp_ext_instance *)0x0) {
              plVar11 = (lysp_ext_instance *)0x0;
            }
            else {
              plVar11 = plVar6->exts[-1].exts;
            }
            bVar8 = false;
            memset(plVar10 + *plVar10 * 9 + 1,0,((long)&plVar11->name + (long)pvVar18) * 0x48);
            bVar7 = true;
          }
          if (bVar7) {
            lVar22 = 0;
            plVar11 = (lysp_ext_instance *)0x0;
            while( true ) {
              plVar4 = plVar6->exts;
              if (plVar4 == (lysp_ext_instance *)0x0) {
                plVar12 = (lysp_ext_instance *)0x0;
              }
              else {
                plVar12 = plVar4[-1].exts;
              }
              if (plVar12 <= plVar11) break;
              plVar3 = module->exts;
              pvVar18 = plVar3[-1].compiled;
              plVar3[-1].compiled = (void *)((long)pvVar18 + 1);
              LVar9 = lys_compile_ext(&local_10d0,
                                      (lysp_ext_instance *)((long)&plVar4->name + lVar22),
                                      plVar3 + (-(ulong)(plVar3 == (lysc_ext_instance *)0x0) |
                                               (ulong)pvVar18),module);
              if (LVar9 != LY_SUCCESS) {
                if (LVar9 != LY_ENOT) {
                  bVar8 = true;
                  goto LAB_00142856;
                }
                ppvVar1 = &module->exts[-1].compiled;
                *ppvVar1 = (void *)((long)*ppvVar1 + -1);
              }
              plVar11 = (lysp_ext_instance *)((long)&plVar11->name + 1);
              lVar22 = lVar22 + 0x70;
              LVar9 = LY_SUCCESS;
            }
            bVar8 = false;
          }
LAB_00142856:
          if (bVar8) goto LAB_001428f6;
        }
        uVar17 = uVar17 + 1;
      } while( true );
    }
    plVar3 = module->exts;
    if (plVar3 == (lysc_ext_instance *)0x0) {
      pvVar18 = (void *)0x0;
      plVar10 = (long *)calloc(1,(long)plVar11[-1].exts * 0x48 + 8);
    }
    else {
      pvVar18 = plVar3[-1].compiled;
      plVar10 = (long *)realloc(&plVar3[-1].compiled,
                                ((long)&(plVar11[-1].exts)->name +
                                (long)plVar3[-1].compiled + (long)pvVar18) * 0x48 + 8);
    }
    if (plVar10 == (long *)0x0) {
      bVar7 = false;
      LVar9 = LY_EMEM;
      ly_log(local_10d0.ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).");
      bVar8 = true;
    }
    else {
      module->exts = (lysc_ext_instance *)(plVar10 + 1);
      LVar9 = LY_SUCCESS;
      if (plVar2->exts == (lysp_ext_instance *)0x0) {
        plVar11 = (lysp_ext_instance *)0x0;
      }
      else {
        plVar11 = plVar2->exts[-1].exts;
      }
      memset(plVar10 + *plVar10 * 9 + 1,0,((long)&plVar11->name + (long)pvVar18) * 0x48);
      bVar7 = true;
      bVar8 = false;
    }
    if (bVar7) {
      lVar22 = 0;
      plVar11 = (lysp_ext_instance *)0x0;
      while( true ) {
        plVar4 = plVar2->exts;
        if (plVar4 == (lysp_ext_instance *)0x0) {
          plVar12 = (lysp_ext_instance *)0x0;
        }
        else {
          plVar12 = plVar4[-1].exts;
        }
        if (plVar12 <= plVar11) break;
        plVar3 = module->exts;
        pvVar18 = plVar3[-1].compiled;
        plVar3[-1].compiled = (void *)((long)pvVar18 + 1);
        LVar9 = lys_compile_ext(&local_10d0,(lysp_ext_instance *)((long)&plVar4->name + lVar22),
                                plVar3 + (-(ulong)(plVar3 == (lysc_ext_instance *)0x0) |
                                         (ulong)pvVar18),module);
        if (LVar9 != LY_SUCCESS) {
          if (LVar9 != LY_ENOT) {
            bVar8 = true;
            goto LAB_00142601;
          }
          ppvVar1 = &module->exts[-1].compiled;
          *ppvVar1 = (void *)((long)*ppvVar1 + -1);
        }
        plVar11 = (lysp_ext_instance *)((long)&plVar11->name + 1);
        lVar22 = lVar22 + 0x70;
        LVar9 = LY_SUCCESS;
      }
      bVar8 = false;
    }
LAB_00142601:
    if (!bVar8) {
      if (bVar8) {
        return LVar9;
      }
      goto LAB_00142612;
    }
  }
  goto LAB_001421f1;
LAB_001428f6:
  if (!bVar8) {
    return LVar9;
  }
  goto LAB_001421f1;
  while (plVar13 = (plVar13->field_0).field_1.next, plVar13 != (lysp_node_grp *)0x0) {
LAB_00142887:
    if (((undefined1  [64])((undefined1  [64])plVar13->field_0 & (undefined1  [64])0x4000000) ==
         (undefined1  [64])0x0) &&
       (LVar9 = lys_compile_grouping(&local_10d0,(lysp_node *)0x0,plVar13), LVar9 != LY_SUCCESS))
    goto LAB_001421f1;
  }
LAB_001428ae:
  for (plVar21 = plVar2->data; plVar21 != (lysp_node *)0x0; plVar21 = plVar21->next) {
    for (plVar13 = lysp_node_groupings(plVar21); plVar13 != (lysp_node_grp *)0x0;
        plVar13 = (plVar13->field_0).field_1.next) {
      if (((undefined1  [64])((undefined1  [64])plVar13->field_0 & (undefined1  [64])0x4000000) ==
           (undefined1  [64])0x0) &&
         (LVar9 = lys_compile_grouping(&local_10d0,plVar21,plVar13), LVar9 != LY_SUCCESS))
      goto LAB_001421f1;
    }
  }
  local_10e0 = 0;
  while( true ) {
    plVar5 = plVar2->includes;
    if (plVar5 == (lysp_include *)0x0) {
      uVar17 = 0;
    }
    else {
      uVar17 = *(ulong *)(plVar5[-1].rev + 8);
    }
    if (uVar17 <= local_10e0) break;
    plVar6 = plVar5[local_10e0].submodule;
    local_10d0.pmod = (lysp_module *)plVar6;
    for (plVar13 = plVar6->groupings; plVar13 != (lysp_node_grp *)0x0;
        plVar13 = (plVar13->field_0).field_1.next) {
      if (((undefined1  [64])((undefined1  [64])plVar13->field_0 & (undefined1  [64])0x4000000) ==
           (undefined1  [64])0x0) &&
         (LVar9 = lys_compile_grouping(&local_10d0,(lysp_node *)0x0,plVar13), LVar9 != LY_SUCCESS))
      goto LAB_001421f1;
    }
    for (plVar21 = plVar6->data; plVar21 != (lysp_node *)0x0; plVar21 = plVar21->next) {
      for (plVar13 = lysp_node_groupings(plVar21); plVar13 != (lysp_node_grp *)0x0;
          plVar13 = (plVar13->field_0).field_1.next) {
        if (((undefined1  [64])((undefined1  [64])plVar13->field_0 & (undefined1  [64])0x4000000) ==
             (undefined1  [64])0x0) &&
           (LVar9 = lys_compile_grouping(&local_10d0,plVar21,plVar13), LVar9 != LY_SUCCESS))
        goto LAB_001421f1;
      }
    }
    local_10e0 = local_10e0 + 1;
  }
  local_10d0.pmod = (lysp_module *)plVar2;
  ly_log_location_revert(0,0,1,0);
  LVar9 = lys_compile_unres_mod(&local_10d0);
LAB_001421f1:
  ly_log_location_revert(0,0,1,0);
  ly_set_erase(&local_10d0.groupings,(_func_void_void_ptr *)0x0);
  ly_set_erase(&local_10d0.tpdf_chain,(_func_void_void_ptr *)0x0);
  if ((char)LVar9 == '\0') {
    if (local_10d0.augs.count == 0) {
      if (local_10d0.devs.count == 0) {
        ly_set_erase(&local_10d0.augs,(_func_void_void_ptr *)0x0);
        ly_set_erase(&local_10d0.devs,(_func_void_void_ptr *)0x0);
        ly_set_erase(&local_10d0.uses_augs,(_func_void_void_ptr *)0x0);
        goto LAB_001422ff;
      }
      uVar16 = 0x68a;
    }
    else {
      uVar16 = 0x689;
    }
    ly_log(local_10d0.ctx,LY_LLERR,LY_EINT,"Internal error (%s:%d).",
           "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/schema_compile.c"
           ,uVar16);
  }
  else {
    if (local_10d0.augs.count != 0) {
      uVar17 = 0;
      do {
        lysc_augment_free(local_10d0.ctx,(lysc_augment *)local_10d0.augs.field_2.dnodes[uVar17]);
        uVar17 = uVar17 + 1;
      } while (uVar17 < local_10d0.augs.count);
    }
    ly_set_erase(&local_10d0.augs,(_func_void_void_ptr *)0x0);
    if (local_10d0.devs.count != 0) {
      uVar17 = 0;
      do {
        lysc_deviation_free(local_10d0.ctx,(lysc_deviation *)local_10d0.devs.field_2.dnodes[uVar17])
        ;
        uVar17 = uVar17 + 1;
      } while (uVar17 < local_10d0.devs.count);
    }
    ly_set_erase(&local_10d0.devs,(_func_void_void_ptr *)0x0);
    if (local_10d0.uses_augs.count != 0) {
      uVar17 = 0;
      do {
        lysc_augment_free(local_10d0.ctx,(lysc_augment *)local_10d0.uses_augs.field_2.dnodes[uVar17]
                         );
        uVar17 = uVar17 + 1;
      } while (uVar17 < local_10d0.uses_augs.count);
    }
    ly_set_erase(&local_10d0.uses_augs,(_func_void_void_ptr *)0x0);
    if (local_10d0.uses_rfns.count != 0) {
      uVar17 = 0;
      do {
        lysc_refine_free(local_10d0.ctx,(lysc_refine *)local_10d0.uses_rfns.field_2.dnodes[uVar17]);
        uVar17 = uVar17 + 1;
      } while (uVar17 < local_10d0.uses_rfns.count);
    }
LAB_001422ff:
    ly_set_erase(&local_10d0.uses_rfns,(_func_void_void_ptr *)0x0);
  }
  if (LVar9 != LY_SUCCESS) {
    lysc_module_free(&local_10d0.free_ctx,module);
    mod->compiled = (lysc_module *)0x0;
  }
  return LVar9;
}

Assistant:

LY_ERR
lys_compile(struct lys_module *mod, struct lys_depset_unres *unres)
{
    struct lysc_ctx ctx = {0};
    struct lysc_module *mod_c = NULL;
    struct lysp_module *sp;
    struct lysp_submodule *submod;
    struct lysp_node *pnode;
    struct lysp_node_grp *grp;
    LY_ARRAY_COUNT_TYPE u;
    LY_ERR ret = LY_SUCCESS;

    LY_CHECK_ARG_RET(NULL, mod, mod->parsed, !mod->compiled, mod->ctx, LY_EINVAL);

    assert(mod->implemented && mod->to_compile);

    sp = mod->parsed;
    LYSC_CTX_INIT_PMOD(ctx, sp, NULL);
    ctx.unres = unres;

    ++mod->ctx->change_count;
    mod->compiled = mod_c = calloc(1, sizeof *mod_c);
    LY_CHECK_ERR_RET(!mod_c, LOGMEM(mod->ctx), LY_EMEM);
    mod_c->mod = mod;

    /* compile augments and deviations of our module from other modules so they can be applied during compilation */
    LY_CHECK_GOTO(ret = lys_precompile_own_augments(&ctx), cleanup);
    LY_CHECK_GOTO(ret = lys_precompile_own_deviations(&ctx), cleanup);

    /* data nodes */
    LY_LIST_FOR(sp->data, pnode) {
        LY_CHECK_GOTO(ret = lys_compile_node(&ctx, pnode, NULL, 0, NULL), cleanup);
    }

    /* top-level RPCs */
    LY_LIST_FOR((struct lysp_node *)sp->rpcs, pnode) {
        LY_CHECK_GOTO(ret = lys_compile_node(&ctx, pnode, NULL, 0, NULL), cleanup);
    }

    /* top-level notifications */
    LY_LIST_FOR((struct lysp_node *)sp->notifs, pnode) {
        LY_CHECK_GOTO(ret = lys_compile_node(&ctx, pnode, NULL, 0, NULL), cleanup);
    }

    /* module extension instances */
    COMPILE_EXTS_GOTO(&ctx, sp->exts, mod_c->exts, mod_c, ret, cleanup);

    /* the same for submodules */
    LY_ARRAY_FOR(sp->includes, u) {
        submod = sp->includes[u].submodule;
        ctx.pmod = (struct lysp_module *)submod;

        LY_LIST_FOR(submod->data, pnode) {
            ret = lys_compile_node(&ctx, pnode, NULL, 0, NULL);
            LY_CHECK_GOTO(ret, cleanup);
        }

        LY_LIST_FOR((struct lysp_node *)submod->rpcs, pnode) {
            ret = lys_compile_node(&ctx, pnode, NULL, 0, NULL);
            LY_CHECK_GOTO(ret, cleanup);
        }

        LY_LIST_FOR((struct lysp_node *)submod->notifs, pnode) {
            ret = lys_compile_node(&ctx, pnode, NULL, 0, NULL);
            LY_CHECK_GOTO(ret, cleanup);
        }

        COMPILE_EXTS_GOTO(&ctx, submod->exts, mod_c->exts, mod_c, ret, cleanup);
    }
    ctx.pmod = sp;

    /* validate non-instantiated groupings from the parsed schema,
     * without it we would accept even the schemas with invalid grouping specification */
    ctx.compile_opts |= LYS_COMPILE_GROUPING;
    LY_LIST_FOR(sp->groupings, grp) {
        if (!(grp->flags & LYS_USED_GRP)) {
            LY_CHECK_GOTO(ret = lys_compile_grouping(&ctx, NULL, grp), cleanup);
        }
    }
    LY_LIST_FOR(sp->data, pnode) {
        LY_LIST_FOR((struct lysp_node_grp *)lysp_node_groupings(pnode), grp) {
            if (!(grp->flags & LYS_USED_GRP)) {
                LY_CHECK_GOTO(ret = lys_compile_grouping(&ctx, pnode, grp), cleanup);
            }
        }
    }
    LY_ARRAY_FOR(sp->includes, u) {
        submod = sp->includes[u].submodule;
        ctx.pmod = (struct lysp_module *)submod;

        LY_LIST_FOR(submod->groupings, grp) {
            if (!(grp->flags & LYS_USED_GRP)) {
                LY_CHECK_GOTO(ret = lys_compile_grouping(&ctx, NULL, grp), cleanup);
            }
        }
        LY_LIST_FOR(submod->data, pnode) {
            LY_LIST_FOR((struct lysp_node_grp *)lysp_node_groupings(pnode), grp) {
                if (!(grp->flags & LYS_USED_GRP)) {
                    LY_CHECK_GOTO(ret = lys_compile_grouping(&ctx, pnode, grp), cleanup);
                }
            }
        }
    }
    ctx.pmod = sp;

    ly_log_location_revert(0, 0, 1, 0);

    /* finish compilation for all unresolved module items in the context */
    LY_CHECK_GOTO(ret = lys_compile_unres_mod(&ctx), cleanup);

cleanup:
    ly_log_location_revert(0, 0, 1, 0);
    lys_compile_unres_mod_erase(&ctx, ret);
    if (ret) {
        lysc_module_free(&ctx.free_ctx, mod_c);
        mod->compiled = NULL;
    }
    return ret;
}